

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenTypeGet_ObjectAPI_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,Type type,IDLOptions *opts)

{
  string *psVar1;
  string *this_00;
  string *this_01;
  string sStack_68;
  string local_48;
  
  this_00 = &sStack_68;
  this_01 = &sStack_68;
  GenTypeGet_abi_cxx11_(__return_storage_ptr__,this,&type);
  if (type.base_type - BASE_TYPE_VECTOR < 2) {
LAB_0017932a:
    if (type.struct_def == (StructDef *)0x0) {
      if (type.element != BASE_TYPE_UNION) goto LAB_001793d7;
      NamespacedName_abi_cxx11_(&sStack_68,this,&(type.enum_def)->super_Definition);
      std::operator+(&local_48,&sStack_68,"Union");
      goto LAB_001793b4;
    }
    psVar1 = (string *)((type.struct_def)->super_Definition).name._M_string_length;
    GenTypeName_ObjectAPI(&local_48,this,(string *)type.struct_def,opts);
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length - (long)psVar1
               ,psVar1);
    this_00 = &local_48;
  }
  else {
    if (type.base_type != BASE_TYPE_UNION) {
      if (type.base_type != BASE_TYPE_ARRAY) goto LAB_001793d7;
      goto LAB_0017932a;
    }
    NamespacedName_abi_cxx11_(&sStack_68,this,&(type.enum_def)->super_Definition);
    std::operator+(&local_48,&sStack_68,"Union");
LAB_001793b4:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_001793d7:
  if (type.base_type == BASE_TYPE_VECTOR) {
    std::operator+(&sStack_68,"List<",__return_storage_ptr__);
    std::operator+(&local_48,&sStack_68,">");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    if (type.base_type != BASE_TYPE_ARRAY) {
      return __return_storage_ptr__;
    }
    std::operator+(&local_48,__return_storage_ptr__,"[]");
    this_01 = &local_48;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)this_01);
  }
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeGet_ObjectAPI(flatbuffers::Type type,
                                   const IDLOptions &opts) const {
    auto type_name = GenTypeGet(type);
    // Replace to ObjectBaseAPI Type Name
    switch (type.base_type) {
      case BASE_TYPE_STRUCT: FLATBUFFERS_FALLTHROUGH();  // fall thru
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();   // fall thru
      case BASE_TYPE_VECTOR: {
        if (type.struct_def != nullptr) {
          auto type_name_length = type.struct_def->name.length();
          auto new_type_name =
              GenTypeName_ObjectAPI(type.struct_def->name, opts);
          type_name.replace(type_name.length() - type_name_length,
                            type_name_length, new_type_name);
        } else if (type.element == BASE_TYPE_UNION) {
          type_name = NamespacedName(*type.enum_def) + "Union";
        }
        break;
      }

      case BASE_TYPE_UNION: {
        type_name = NamespacedName(*type.enum_def) + "Union";
        break;
      }
      default: break;
    }

    switch (type.base_type) {
      case BASE_TYPE_ARRAY: {
        type_name = type_name + "[]";
        break;
      }
      case BASE_TYPE_VECTOR: {
        type_name = "List<" + type_name + ">";
        break;
      }
      default: break;
    }
    return type_name;
  }